

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# areadump.cc
# Opt level: O0

Area __thiscall Area::getUnion(Area *this,Area *other)

{
  Area AVar1;
  int *piVar2;
  int *in_RSI;
  int *in_RDI;
  Area result;
  Area local_10;
  
  Area(&local_10);
  piVar2 = std::min<int>(in_RDI,in_RSI);
  local_10.minColumn = *piVar2;
  piVar2 = std::max<int>(in_RDI + 1,in_RSI + 1);
  local_10.maxColumn = *piVar2;
  piVar2 = std::min<int>(in_RDI + 2,in_RSI + 2);
  local_10.minLine = *piVar2;
  piVar2 = std::max<int>(in_RDI + 3,in_RSI + 3);
  AVar1.maxColumn = local_10.maxColumn;
  AVar1.minColumn = local_10.minColumn;
  AVar1.minLine = local_10.minLine;
  AVar1.maxLine = *piVar2;
  return AVar1;
}

Assistant:

Area getUnion(const Area& other) const {
    Area result;
    result.minColumn = std::min(minColumn, other.minColumn);
    result.maxColumn = std::max(maxColumn, other.maxColumn);
    result.minLine = std::min(minLine, other.minLine);
    result.maxLine = std::max(maxLine, other.maxLine);
    return result;
  }